

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

Extra_SymmInfo_t * Extra_SymmPairsAllocate(int nVars)

{
  Extra_SymmInfo_t *pEVar1;
  int *piVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  pEVar1 = (Extra_SymmInfo_t *)malloc(0x20);
  pEVar1->nVars = 0;
  pEVar1->nVarsMax = 0;
  pEVar1->nSymms = 0;
  pEVar1->nNodes = 0;
  pEVar1->pVars = (int *)0x0;
  pEVar1->pSymms = (char **)0x0;
  pEVar1->nVars = nVars;
  lVar6 = (long)nVars;
  piVar2 = (int *)malloc(lVar6 * 4);
  pEVar1->pVars = piVar2;
  ppcVar3 = (char **)malloc(lVar6 * 8);
  pEVar1->pSymms = ppcVar3;
  pcVar4 = (char *)malloc((ulong)(uint)(nVars * nVars));
  *ppcVar3 = pcVar4;
  memset(pcVar4,0,(ulong)(uint)(nVars * nVars));
  if (1 < nVars) {
    pcVar4 = *ppcVar3;
    uVar5 = 1;
    do {
      pcVar4 = pcVar4 + lVar6;
      ppcVar3[uVar5] = pcVar4;
      uVar5 = uVar5 + 1;
    } while ((uint)nVars != uVar5);
  }
  return pEVar1;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsAllocate( int nVars )
{
    int i;
    Extra_SymmInfo_t * p;

    // allocate and clean the storage for symmetry info
    p = ABC_ALLOC( Extra_SymmInfo_t, 1 );
    memset( p, 0, sizeof(Extra_SymmInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( int, nVars );  
    p->pSymms    = ABC_ALLOC( char *, nVars );  
    p->pSymms[0] = ABC_ALLOC( char  , nVars * nVars );
    memset( p->pSymms[0], 0, nVars * nVars * sizeof(char) );

    for ( i = 1; i < nVars; i++ )
        p->pSymms[i] = p->pSymms[i-1] + nVars;

    return p;
}